

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

int run_test_fork_fs_events_file_parent_child(void)

{
  int iVar1;
  __pid_t child_pid;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  char *name;
  uv_loop_t *handle;
  undefined1 *unaff_R14;
  uv_fs_event_t fs_event;
  uv_timer_t timer;
  uv_work_t uStackY_8c0;
  uv_loop_t *puStackY_840;
  uv_loop_t uStackY_838;
  uv_loop_t *puStackY_4e8;
  uv_buf_t uStack_4d0;
  uv_fs_t uStack_4c0;
  uv_loop_t *puStack_308;
  code *pcStack_300;
  uv_loop_t *puStack_2f8;
  undefined1 auStack_2f0 [448];
  uv_timer_t local_a0;
  
  puVar4 = uv_default_loop();
  name = "watch_file";
  remove("watch_file");
  create_file(name);
  iVar1 = uv_fs_event_init(puVar4,(uv_fs_event_t *)&stack0xfffffffffffffed8);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start((uv_fs_event_t *)&stack0xfffffffffffffed8,fs_event_cb_file_current_dir
                              ,"watch_file",0);
    if (iVar1 != 0) goto LAB_0014d297;
    iVar1 = uv_timer_init(puVar4,&local_a0);
    if (iVar1 != 0) goto LAB_0014d29c;
    child_pid = fork();
    if (child_pid != 0) {
      if (child_pid != -1) {
        assert_wait_child(child_pid);
LAB_0014d253:
        puVar4 = uv_default_loop();
        uv_walk(puVar4,close_walk_cb,(void *)0x0);
        uv_run(puVar4,UV_RUN_DEFAULT);
        puVar5 = uv_default_loop();
        iVar1 = uv_loop_close(puVar5);
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_0014d2a1;
      }
      goto LAB_0014d2a6;
    }
    puts("Running child");
    iVar1 = uv_loop_fork(puVar4);
    if (iVar1 != 0) goto LAB_0014d2ab;
    iVar1 = uv_timer_start(&local_a0,timer_cb_touch,100,0);
    if (iVar1 != 0) goto LAB_0014d2b0;
    if (timer_cb_touch_called != 0) goto LAB_0014d2b5;
    if (fs_event_cb_called == '\x01') goto LAB_0014d2ba;
    puts("Running loop in child ");
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (timer_cb_touch_called != 1) goto LAB_0014d2bf;
    if (fs_event_cb_called != '\0') {
      remove("watch_file");
      fs_event_cb_called = '\0';
      timer_cb_touch_called = 0;
      uv_run(puVar4,UV_RUN_DEFAULT);
      goto LAB_0014d253;
    }
  }
  else {
    run_test_fork_fs_events_file_parent_child_cold_1();
LAB_0014d297:
    run_test_fork_fs_events_file_parent_child_cold_2();
LAB_0014d29c:
    run_test_fork_fs_events_file_parent_child_cold_3();
LAB_0014d2a1:
    run_test_fork_fs_events_file_parent_child_cold_11();
LAB_0014d2a6:
    run_test_fork_fs_events_file_parent_child_cold_10();
LAB_0014d2ab:
    run_test_fork_fs_events_file_parent_child_cold_4();
LAB_0014d2b0:
    run_test_fork_fs_events_file_parent_child_cold_5();
LAB_0014d2b5:
    run_test_fork_fs_events_file_parent_child_cold_6();
LAB_0014d2ba:
    run_test_fork_fs_events_file_parent_child_cold_9();
LAB_0014d2bf:
    run_test_fork_fs_events_file_parent_child_cold_7();
  }
  run_test_fork_fs_events_file_parent_child_cold_8();
  puVar5 = (uv_loop_t *)auStack_2f0;
  puVar6 = (uv_loop_t *)auStack_2f0;
  handle = (uv_loop_t *)0x0;
  iVar1 = 0x41;
  puStack_2f8 = (uv_loop_t *)0x14d2f2;
  auStack_2f0._440_8_ = puVar4;
  uVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_2f0,"watch_file",0x41,0x180,(uv_fs_cb)0x0);
  if ((int)uVar2 < 0) {
    puStack_2f8 = (uv_loop_t *)0x14d32d;
    create_file_cold_1();
  }
  else {
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    puStack_2f8 = (uv_loop_t *)0x14d303;
    uv_fs_req_cleanup((uv_fs_t *)auStack_2f0);
    handle = (uv_loop_t *)0x0;
    iVar1 = 0;
    puStack_2f8 = (uv_loop_t *)0x14d311;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)auStack_2f0,uVar2,(uv_fs_cb)0x0);
    puVar5 = puVar6;
    unaff_R14 = auStack_2f0;
    if (iVar3 == 0) {
      puStack_2f8 = (uv_loop_t *)0x14d31d;
      uv_fs_req_cleanup((uv_fs_t *)auStack_2f0);
      return extraout_EAX;
    }
  }
  puStack_2f8 = (uv_loop_t *)fs_event_cb_file_current_dir;
  create_file_cold_2();
  puStack_2f8 = puVar4;
  if (fs_event_cb_called == '\x01') {
    pcStack_300 = (code *)0x14d370;
    fs_event_cb_file_current_dir_cold_3();
LAB_0014d370:
    puVar5 = handle;
    pcStack_300 = (code *)0x14d375;
    fs_event_cb_file_current_dir_cold_1();
  }
  else {
    fs_event_cb_called = '\x01';
    if (iVar1 != 0) goto LAB_0014d370;
    pcStack_300 = (code *)0x14d35c;
    iVar1 = strcmp((char *)puVar5,"watch_file");
    puVar4 = handle;
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return extraout_EAX_00;
    }
  }
  pcStack_300 = timer_cb_touch;
  fs_event_cb_file_current_dir_cold_2();
  puStackY_4e8 = (uv_loop_t *)0x14d38b;
  puStack_308 = puVar4;
  pcStack_300 = (code *)unaff_R14;
  uv_close((uv_handle_t *)puVar5,(uv_close_cb)0x0);
  puStackY_4e8 = (uv_loop_t *)0x14d3a9;
  uVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_4c0,"watch_file",2,0,(uv_fs_cb)0x0);
  if ((int)uVar2 < 0) {
    puStackY_4e8 = (uv_loop_t *)0x14d441;
    timer_cb_touch_cold_1();
LAB_0014d441:
    puStackY_4e8 = (uv_loop_t *)0x14d446;
    timer_cb_touch_cold_2();
  }
  else {
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    puStackY_4e8 = (uv_loop_t *)0x14d3c0;
    uv_fs_req_cleanup(&uStack_4c0);
    puStackY_4e8 = (uv_loop_t *)0x14d3d1;
    uStack_4d0 = uv_buf_init("foo",4);
    puStackY_4e8 = (uv_loop_t *)0x14d3fe;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&uStack_4c0,uVar2,&uStack_4d0,1,-1,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_0014d441;
    puStackY_4e8 = (uv_loop_t *)0x14d40f;
    uv_fs_req_cleanup(&uStack_4c0);
    puStackY_4e8 = (uv_loop_t *)0x14d41d;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_4c0,uVar2,(uv_fs_cb)0x0);
    if (iVar1 == 0) {
      puStackY_4e8 = (uv_loop_t *)0x14d42b;
      uv_fs_req_cleanup(&uStack_4c0);
      timer_cb_touch_called = timer_cb_touch_called + 1;
      return extraout_EAX_01;
    }
  }
  puStackY_4e8 = (uv_loop_t *)run_test_fork_threadpool_queue_work_simple;
  timer_cb_touch_cold_3();
  puVar5 = &uStackY_838;
  puStackY_840 = (uv_loop_t *)0x14d458;
  puStackY_4e8 = puVar4;
  puVar4 = uv_default_loop();
  puStackY_840 = (uv_loop_t *)0x14d460;
  assert_run_work(puVar4);
  puStackY_840 = (uv_loop_t *)0x14d465;
  uVar2 = fork();
  if (uVar2 == 0) {
    puStackY_840 = (uv_loop_t *)0x14d48f;
    getpid();
    puStackY_840 = (uv_loop_t *)0x14d49f;
    printf("Running child in %d\n");
    puStackY_840 = (uv_loop_t *)0x14d4aa;
    uv_loop_init(&uStackY_838);
    puStackY_840 = (uv_loop_t *)0x14d4b6;
    puts("Child first watch");
    puStackY_840 = (uv_loop_t *)0x14d4be;
    assert_run_work(&uStackY_838);
    puStackY_840 = (uv_loop_t *)0x14d4c6;
    uv_loop_close(&uStackY_838);
    puStackY_840 = (uv_loop_t *)0x14d4d2;
    puts("Child second watch default loop");
    puStackY_840 = (uv_loop_t *)0x14d4d7;
    puVar4 = uv_default_loop();
    puStackY_840 = (uv_loop_t *)0x14d4df;
    iVar1 = uv_loop_fork(puVar4);
    if (iVar1 == 0) {
      puStackY_840 = (uv_loop_t *)0x14d4e8;
      puVar4 = uv_default_loop();
      puStackY_840 = (uv_loop_t *)0x14d4f0;
      assert_run_work(puVar4);
      puStackY_840 = (uv_loop_t *)0x14d4fc;
      puts("Exiting child ");
      goto LAB_0014d4fc;
    }
  }
  else {
    puVar5 = (uv_loop_t *)(ulong)uVar2;
    if (uVar2 != 0xffffffff) {
      puStackY_840 = (uv_loop_t *)0x14d479;
      puVar4 = uv_default_loop();
      puStackY_840 = (uv_loop_t *)0x14d481;
      assert_run_work(puVar4);
      puStackY_840 = (uv_loop_t *)0x14d488;
      assert_wait_child(uVar2);
LAB_0014d4fc:
      puStackY_840 = (uv_loop_t *)0x14d501;
      puVar5 = uv_default_loop();
      puStackY_840 = (uv_loop_t *)0x14d515;
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      puStackY_840 = (uv_loop_t *)0x14d51f;
      uv_run(puVar5,UV_RUN_DEFAULT);
      puStackY_840 = (uv_loop_t *)0x14d524;
      puVar4 = uv_default_loop();
      puStackY_840 = (uv_loop_t *)0x14d52c;
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
      puStackY_840 = (uv_loop_t *)0x14d540;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    puStackY_840 = (uv_loop_t *)0x14d545;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  puStackY_840 = (uv_loop_t *)assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  puStackY_840 = puVar5;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014d5ee;
    uVar2 = getpid();
    printf("Queue in %d\n",(ulong)uVar2);
    puVar5 = puVar4;
    iVar1 = uv_queue_work(puVar4,&uStackY_8c0,work_cb,after_work_cb);
    if (iVar1 != 0) goto LAB_0014d5f3;
    getpid();
    printf("Running in %d\n");
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return 0;
      }
      goto LAB_0014d5fd;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014d5ee:
    assert_run_work_cold_2();
    puVar5 = puVar4;
LAB_0014d5f3:
    puVar4 = puVar5;
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014d5fd:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fork_fs_events_file_parent_child) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  /* It's not possible to implement this without additional
   * bookkeeping on SunOS. For AIX it is possible, but has to be
   * written. See https://github.com/libuv/libuv/pull/846#issuecomment-287170420
   * TODO: On z/OS, we need to open another message queue and subscribe to the
   * same events as the parent.
   */
  return 0;
#else
  /* Establishing a started fs events watcher in the parent should
     still work in the child. */
  uv_timer_t timer;
  uv_fs_event_t fs_event;
  int r;
  pid_t child_pid;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* Setup */
  remove("watch_file");
  create_file("watch_file");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file_current_dir,
                        "watch_file",
                        0);
  ASSERT(r == 0);

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  child_pid = fork();
  ASSERT(child_pid != -1);
  if (child_pid != 0) {
    /* parent */
    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Running child\n");
    ASSERT(0 == uv_loop_fork(loop));

    r = uv_timer_start(&timer, timer_cb_touch, 100, 0);
    ASSERT(r == 0);

    ASSERT(timer_cb_touch_called == 0);
    ASSERT(fs_event_cb_called == 0);
    printf("Running loop in child \n");
    uv_run(loop, UV_RUN_DEFAULT);

    ASSERT(timer_cb_touch_called == 1);
    ASSERT(fs_event_cb_called == 1);

    /* Cleanup */
    remove("watch_file");
    fs_event_cb_called = 0;
    timer_cb_touch_called = 0;
    uv_run(loop, UV_RUN_DEFAULT); /* Flush pending closes. */
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}